

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# olcPixelGameEngine.h
# Opt level: O2

void __thiscall
olc::PixelGameEngine::DrawRotatedDecal
          (PixelGameEngine *this,vf2d *pos,Decal *decal,float fAngle,vf2d *center,vf2d *scale,
          Pixel *tint)

{
  undefined4 uVar1;
  undefined4 uVar3;
  undefined8 uVar2;
  uint32_t uVar4;
  long lVar5;
  v2d_generic<float> vVar6;
  v2d_generic<float> vVar7;
  v2d_generic<float> vVar8;
  double dVar9;
  double dVar10;
  v2d_generic<float> vVar11;
  float fVar12;
  float fVar13;
  undefined8 local_c8;
  undefined8 uStack_c0;
  undefined8 local_b8;
  undefined8 uStack_b0;
  undefined1 local_a0 [8];
  undefined1 local_98 [24];
  vector<olc::v2d_generic<float>,std::allocator<olc::v2d_generic<float>>> avStack_80 [8];
  undefined1 local_78 [16];
  undefined1 local_68 [16];
  undefined1 local_58 [16];
  undefined1 local_48 [16];
  undefined8 local_38;
  
  local_98._0_16_ = ZEXT416(0);
  local_38._0_4_ = NORMAL;
  local_38._4_4_ = 0;
  local_a0 = (undefined1  [8])decal;
  unique0x100003d1 = local_98._0_16_;
  local_78 = local_98._0_16_;
  local_68 = local_98._0_16_;
  local_58 = local_98._0_16_;
  local_48 = local_98._0_16_;
  std::vector<olc::v2d_generic<float>,_std::allocator<olc::v2d_generic<float>_>_>::resize
            ((vector<olc::v2d_generic<float>,_std::allocator<olc::v2d_generic<float>_>_> *)local_98,
             4);
  local_c8 = 0;
  uStack_c0 = 0x3f80000000000000;
  local_b8 = 0x3f8000003f800000;
  uStack_b0 = 0x3f800000;
  std::vector<olc::v2d_generic<float>,std::allocator<olc::v2d_generic<float>>>::
  _M_assign_aux<olc::v2d_generic<float>const*>(avStack_80,&local_c8);
  local_c8 = 0x3f8000003f800000;
  uStack_c0 = 0x3f8000003f800000;
  std::vector<float,std::allocator<float>>::_M_assign_aux<float_const*>
            ((vector<float,std::allocator<float>> *)local_68,&local_c8);
  uVar4 = (tint->field_0).n;
  local_c8 = CONCAT44(uVar4,uVar4);
  uStack_c0 = CONCAT44(uVar4,uVar4);
  std::vector<olc::Pixel,std::allocator<olc::Pixel>>::_M_assign_aux<olc::Pixel_const*>
            ((vector<olc::Pixel,std::allocator<olc::Pixel>> *)(local_58 + 8),&local_c8);
  local_38._4_4_ = 4;
  vVar6.x = (*scale).x * (0.0 - (*center).x);
  vVar6.y = (*scale).y * (0.0 - (*center).y);
  *(v2d_generic<float> *)local_98._0_8_ = vVar6;
  vVar7.x = (*scale).x * (0.0 - (*center).x);
  vVar7.y = (*scale).y * ((float)decal->sprite->height - (*center).y);
  *(v2d_generic<float> *)(local_98._0_8_ + 8) = vVar7;
  uVar1 = decal->sprite->width;
  uVar3 = decal->sprite->height;
  vVar11.x = (*scale).x * ((float)(int)uVar1 - (*center).x);
  vVar11.y = (*scale).y * ((float)(int)uVar3 - (*center).y);
  *(v2d_generic<float> *)(local_98._0_8_ + 0x10) = vVar11;
  vVar8.x = (*scale).x * ((float)decal->sprite->width - (*center).x);
  vVar8.y = (*scale).y * (0.0 - (*center).y);
  *(v2d_generic<float> *)(local_98._0_8_ + 0x18) = vVar8;
  dVar9 = cos((double)fAngle);
  dVar10 = sin((double)fAngle);
  for (lVar5 = 0; lVar5 != 0x10; lVar5 = lVar5 + 4) {
    fVar12 = *(float *)((long)(float *)local_98._0_8_ + lVar5 * 2);
    fVar13 = *(float *)((long)(local_98._0_8_ + 4) + lVar5 * 2);
    *(ulong *)((long)(float *)local_98._0_8_ + lVar5 * 2) =
         CONCAT44((*pos).y + fVar12 * (float)dVar10 + fVar13 * (float)dVar9,
                  (*pos).x + fVar12 * (float)dVar9 + -fVar13 * (float)dVar10);
    uVar2 = *(undefined8 *)((long)(float *)local_98._0_8_ + lVar5 * 2);
    fVar12 = (this->vInvScreenSize).x * (float)uVar2;
    fVar13 = (this->vInvScreenSize).y * (float)((ulong)uVar2 >> 0x20);
    *(ulong *)((long)(float *)local_98._0_8_ + lVar5 * 2) =
         CONCAT44(fVar13 + fVar13 + -1.0,fVar12 + fVar12 + -1.0);
    *(uint *)((long)(local_98._0_8_ + 4) + lVar5 * 2) =
         *(uint *)((long)(local_98._0_8_ + 4) + lVar5 * 2) ^ 0x80000000;
    *(undefined4 *)(local_68._0_8_ + lVar5) = 0x3f800000;
  }
  local_38._0_4_ = this->nDecalMode;
  std::vector<olc::DecalInstance,_std::allocator<olc::DecalInstance>_>::push_back
            (&(this->vLayers).super__Vector_base<olc::LayerDesc,_std::allocator<olc::LayerDesc>_>.
              _M_impl.super__Vector_impl_data._M_start[this->nTargetLayer].vecDecalInstance,
             (value_type *)local_a0);
  DecalInstance::~DecalInstance((DecalInstance *)local_a0);
  return;
}

Assistant:

void PixelGameEngine::DrawRotatedDecal(const olc::vf2d &pos, olc::Decal *decal, const float fAngle, const olc::vf2d &center, const olc::vf2d &scale, const olc::Pixel &tint)
	{
		DecalInstance di;
		di.decal = decal;
		di.pos.resize(4);
		di.uv = {{0.0f, 0.0f}, {0.0f, 1.0f}, {1.0f, 1.0f}, {1.0f, 0.0f}};
		di.w = {1, 1, 1, 1};
		di.tint = {tint, tint, tint, tint};
		di.points = 4;
		di.pos[0] = (olc::vf2d(0.0f, 0.0f) - center) * scale;
		di.pos[1] = (olc::vf2d(0.0f, float(decal->sprite->height)) - center) * scale;
		di.pos[2] = (olc::vf2d(float(decal->sprite->width), float(decal->sprite->height)) - center) * scale;
		di.pos[3] = (olc::vf2d(float(decal->sprite->width), 0.0f) - center) * scale;
		float c = cos(fAngle), s = sin(fAngle);
		for (int i = 0; i < 4; i++)
		{
			di.pos[i] = pos + olc::vf2d(di.pos[i].x * c - di.pos[i].y * s, di.pos[i].x * s + di.pos[i].y * c);
			di.pos[i] = di.pos[i] * vInvScreenSize * 2.0f - olc::vf2d(1.0f, 1.0f);
			di.pos[i].y *= -1.0f;
			di.w[i] = 1;
		}
		di.mode = nDecalMode;
		vLayers[nTargetLayer].vecDecalInstance.push_back(di);
	}